

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O1

MSize tab_len_slow(GCtab *t,size_t hi)

{
  uint uVar1;
  cTValue *pcVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  uVar1 = t->asize;
  uVar7 = hi + 1;
  while( true ) {
    uVar4 = (uint)uVar7;
    if (uVar4 < uVar1) {
      pcVar2 = (cTValue *)((long)(int)uVar4 * 8 + (t->array).ptr64);
    }
    else {
      pcVar2 = lj_tab_getinth(t,uVar4);
    }
    if ((pcVar2 == (cTValue *)0x0) || (pcVar2->u64 == 0xffffffffffffffff)) break;
    bVar8 = 0x3ffffffe < uVar7;
    hi = uVar7;
    uVar7 = uVar7 * 2;
    if (bVar8) {
      lVar5 = 0x100000000;
      uVar7 = 0;
      do {
        hi = uVar7;
        uVar4 = (int)hi + 1;
        if (uVar4 < uVar1) {
          pcVar2 = (cTValue *)((lVar5 >> 0x1d) + (t->array).ptr64);
        }
        else {
          pcVar2 = lj_tab_getinth(t,uVar4);
        }
      } while ((pcVar2 != (cTValue *)0x0) &&
              (lVar5 = lVar5 + 0x100000000, uVar7 = (ulong)uVar4, pcVar2->u64 != 0xffffffffffffffff)
              );
LAB_001299b7:
      return (MSize)hi;
    }
  }
  uVar3 = uVar7 - hi;
  while (1 < uVar3) {
    uVar6 = uVar7 + hi >> 1;
    uVar4 = (uint)uVar6;
    if (uVar4 < uVar1) {
      pcVar2 = (cTValue *)((long)(int)uVar4 * 8 + (t->array).ptr64);
    }
    else {
      pcVar2 = lj_tab_getinth(t,uVar4);
    }
    if ((pcVar2 != (cTValue *)0x0) && (pcVar2->u64 != 0xffffffffffffffff)) {
      hi = uVar6;
      uVar6 = uVar7;
    }
    uVar7 = uVar6;
    uVar3 = uVar6 - hi;
  }
  goto LAB_001299b7;
}

Assistant:

LJ_NOINLINE static MSize tab_len_slow(GCtab *t, size_t hi)
{
  cTValue *tv;
  size_t lo = hi;
  hi++;
  /* Widening search for an upper bound. */
  while ((tv = lj_tab_getint(t, (int32_t)hi)) && !tvisnil(tv)) {
    lo = hi;
    hi += hi;
    if (hi > (size_t)(INT_MAX-2)) {  /* Punt and do a linear search. */
      lo = 1;
      while ((tv = lj_tab_getint(t, (int32_t)lo)) && !tvisnil(tv)) lo++;
      return (MSize)(lo - 1);
    }
  }
  /* Binary search to find a non-nil to nil transition. */
  while (hi - lo > 1) {
    size_t mid = (lo+hi) >> 1;
    cTValue *tvb = lj_tab_getint(t, (int32_t)mid);
    if (tvb && !tvisnil(tvb)) lo = mid; else hi = mid;
  }
  return (MSize)lo;
}